

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::retrieve_clusters
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint max_clusters,
          vector<crnlib::vector<unsigned_int>_> *clusters)

{
  uint uVar1;
  vq_node *pvVar2;
  ulong uVar3;
  vector<unsigned_int> stack;
  uint local_4c;
  vector<unsigned_int> local_48;
  
  vector<crnlib::vector<unsigned_int>_>::resize(clusters,0,false);
  vector<crnlib::vector<unsigned_int>_>::reserve(clusters,max_clusters);
  local_48.m_p = (uint *)0x0;
  local_48.m_size = 0;
  local_48.m_capacity = 0;
  vector<unsigned_int>::reserve(&local_48,0x200);
  uVar3 = 0;
  while( true ) {
    while( true ) {
      pvVar2 = (this->m_nodes).m_p;
      uVar1 = pvVar2[uVar3].m_left;
      if (((int)uVar1 < 0) || ((int)max_clusters < pvVar2[uVar3].m_codebook_index + 2)) break;
      local_4c = pvVar2[uVar3].m_right;
      vector<unsigned_int>::push_back(&local_48,&local_4c);
      uVar3 = (ulong)uVar1;
    }
    vector<crnlib::vector<unsigned_int>_>::resize(clusters,clusters->m_size + 1,false);
    vector<unsigned_int>::operator=(clusters->m_p + (clusters->m_size - 1),&pvVar2[uVar3].m_vectors)
    ;
    if (local_48.m_size == 0) break;
    local_48.m_size = local_48.m_size - 1;
    uVar3 = (ulong)local_48.m_p[local_48.m_size];
  }
  vector<unsigned_int>::~vector(&local_48);
  return;
}

Assistant:

void retrieve_clusters(uint max_clusters, crnlib::vector<crnlib::vector<uint>>& clusters) const
        {
            clusters.resize(0);
            clusters.reserve(max_clusters);

            crnlib::vector<uint> stack;
            stack.reserve(512);

            uint cur_node_index = 0;

            for (;;)
            {
                const vq_node& cur_node = m_nodes[cur_node_index];

                if ((cur_node.is_leaf()) || ((cur_node.m_codebook_index + 2) > (int)max_clusters))
                {
                    clusters.resize(clusters.size() + 1);
                    clusters.back() = cur_node.m_vectors;

                    if (stack.empty())
                    {
                        break;
                    }
                    cur_node_index = stack.back();
                    stack.pop_back();
                    continue;
                }

                cur_node_index = cur_node.m_left;
                stack.push_back(cur_node.m_right);
            }
        }